

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::DescriptorProto::InternalSerializeWithCachedSizesToArray
          (DescriptorProto *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  string *psVar2;
  char *data;
  Type *pTVar3;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  Type *value_03;
  Type *pTVar4;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.name");
    target = internal::WireFormatLite::WriteStringToArray(1,(this->name_).ptr_,target);
  }
  iVar7 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::FieldDescriptorProto>
                       (2,pTVar3,deterministic,target);
  }
  iVar7 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto>
                       (3,value,deterministic,target);
  }
  iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::EnumDescriptorProto>
                       (4,value_00,deterministic,target);
  }
  iVar7 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto_ExtensionRange>
                       (5,value_01,deterministic,target);
  }
  iVar7 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::FieldDescriptorProto>
                       (6,pTVar3,deterministic,target);
  }
  if ((uVar1 & 2) != 0) {
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::MessageOptions>
                       (7,this->options_,deterministic,target);
  }
  iVar7 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                         (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::OneofDescriptorProto>
                       (8,value_02,deterministic,target);
  }
  iVar7 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    value_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                         (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto_ReservedRange>
                       (9,value_03,deterministic,target);
  }
  iVar7 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  this_00 = &this->reserved_name_;
  for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    data = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar4->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.reserved_name");
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::WriteStringToArray(10,pTVar4,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = DescriptorProto::unknown_fields(this);
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* DescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0, n = this->field_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->field(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0, n = this->nested_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, this->nested_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0, n = this->extension_range_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->extension_range(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->options_, deterministic, target);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0, n = this->oneof_decl_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->oneof_decl(i), deterministic, target);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0, n = this->reserved_range_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, this->reserved_range(i), deterministic, target);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->reserved_name(i).data(), this->reserved_name(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(10, this->reserved_name(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}